

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void row_mt_mem_alloc(AV1_COMP *cpi,int max_rows,int max_cols,int alloc_row_ctx)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  TileDataEnc *pTVar4;
  void *pvVar5;
  ulong uVar6;
  int *piVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  
  uVar2 = (cpi->common).tiles.cols;
  uVar3 = (cpi->common).tiles.rows;
  av1_row_mt_mem_dealloc(cpi);
  iVar9 = 2;
  if (2 < max_cols) {
    iVar9 = max_cols;
  }
  uVar8 = 0;
  if (0 < (int)uVar2) {
    uVar8 = (ulong)uVar2;
  }
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  lVar10 = 0x5cd8;
  for (uVar6 = 0; lVar11 = lVar10, uVar12 = uVar8, uVar6 != uVar3; uVar6 = uVar6 + 1) {
    while (uVar12 != 0) {
      pTVar4 = cpi->tile_data;
      row_mt_sync_mem_alloc
                ((AV1EncRowMultiThreadSync *)
                 ((long)((pTVar4->tctx).txb_skip_cdf + -1) + 0x2e + lVar11),&cpi->common,max_rows);
      if (alloc_row_ctx != 0) {
        pvVar5 = aom_memalign(0x10,(ulong)(iVar9 - 1) * 0x52fc);
        *(void **)((long)pTVar4 + lVar11 + -0x9b8) = pvVar5;
        if (pvVar5 == (void *)0x0) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate this_tile->row_ctx");
        }
      }
      lVar11 = lVar11 + 0x5d10;
      uVar12 = uVar12 - 1;
    }
    lVar10 = lVar10 + (long)(int)uVar2 * 0x5d10;
  }
  bVar1 = (byte)((cpi->common).seq_params)->mib_size_log2;
  iVar9 = (cpi->common).mi_params.mi_rows + (1 << (bVar1 & 0x1f)) + -1 >> (bVar1 & 0x1f);
  piVar7 = (int *)aom_malloc((long)iVar9 << 2);
  (cpi->mt_info).enc_row_mt.num_tile_cols_done = piVar7;
  if (piVar7 == (int *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate enc_row_mt->num_tile_cols_done");
  }
  (cpi->mt_info).enc_row_mt.allocated_rows = max_rows;
  (cpi->mt_info).enc_row_mt.allocated_cols = max_cols + -1;
  (cpi->mt_info).enc_row_mt.allocated_sb_rows = iVar9;
  return;
}

Assistant:

static void row_mt_mem_alloc(AV1_COMP *cpi, int max_rows, int max_cols,
                             int alloc_row_ctx) {
  struct AV1Common *cm = &cpi->common;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int tile_col, tile_row;

  av1_row_mt_mem_dealloc(cpi);

  // Allocate memory for row based multi-threading
  for (tile_row = 0; tile_row < tile_rows; tile_row++) {
    for (tile_col = 0; tile_col < tile_cols; tile_col++) {
      int tile_index = tile_row * tile_cols + tile_col;
      TileDataEnc *const this_tile = &cpi->tile_data[tile_index];

      row_mt_sync_mem_alloc(&this_tile->row_mt_sync, cm, max_rows);

      if (alloc_row_ctx) {
        assert(max_cols > 0);
        const int num_row_ctx = AOMMAX(1, (max_cols - 1));
        CHECK_MEM_ERROR(cm, this_tile->row_ctx,
                        (FRAME_CONTEXT *)aom_memalign(
                            16, num_row_ctx * sizeof(*this_tile->row_ctx)));
      }
    }
  }
  const int sb_rows = get_sb_rows_in_frame(cm);
  CHECK_MEM_ERROR(
      cm, enc_row_mt->num_tile_cols_done,
      aom_malloc(sizeof(*enc_row_mt->num_tile_cols_done) * sb_rows));

  enc_row_mt->allocated_rows = max_rows;
  enc_row_mt->allocated_cols = max_cols - 1;
  enc_row_mt->allocated_sb_rows = sb_rows;
}